

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O3

void webfront::msg::FunctionCall::decodeParameter<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
               span<const_std::byte,_18446744073709551615UL> *data)

{
  byte bVar1;
  ulong uVar2;
  pointer pbVar3;
  long lVar4;
  ostream *poVar5;
  runtime_error *this;
  pointer pbVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"decodeParameter with data size ",0x1f);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes\n",7);
  uVar2 = (data->_M_extent)._M_extent_value;
  if (uVar2 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Not enough data for msg::FunctionCall::decodeParameter")
    ;
    goto LAB_0011af11;
  }
  pbVar3 = data->_M_ptr;
  bVar1 = *pbVar3;
  if (bVar1 < 4) {
    if (bVar1 != 3) {
LAB_0011adf6:
      http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace(param,0,param->_M_string_length,(char *)0x0,0);
      return;
    }
  }
  else {
    if (bVar1 - 5 < 2) {
      uVar7 = (ulong)(ushort)*(undefined2 *)(pbVar3 + 1) + 3;
      if (uVar2 < uVar7) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,"Erroneous data feeded to msg::FunctionCall::decodeParameter");
        goto LAB_0011af11;
      }
      lVar4 = (ulong)(ushort)*(undefined2 *)(pbVar3 + 1) + 3;
      pbVar6 = pbVar3 + 3;
    }
    else {
      if (bVar1 != 4) {
        if (bVar1 != 0x12) goto LAB_0011adf6;
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Wrong parameter type : std::tuple expected");
LAB_0011af11:
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar7 = (ulong)pbVar3[1] + 2;
      if (uVar2 < uVar7) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,"Erroneous data feeded to msg::FunctionCall::decodeParameter");
        goto LAB_0011af11;
      }
      lVar4 = (ulong)pbVar3[1] + 2;
      pbVar6 = pbVar3 + 2;
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pbVar6,pbVar3 + lVar4);
    http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (param,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    data->_M_ptr = data->_M_ptr + uVar7;
    (data->_M_extent)._M_extent_value = (data->_M_extent)._M_extent_value - uVar7;
  }
  return;
}

Assistant:

static void decodeParameter(T& param, std::span<const std::byte>& data) {
        using namespace std;
        cout << "decodeParameter with data size " << data.size() << " bytes\n";
        if (data.size() == 0) throw runtime_error("Not enough data for msg::FunctionCall::decodeParameter");
        auto codedType = static_cast<CodedType>(data[0]);
        switch (codedType) {
        case CodedType::smallString:
            if constexpr (is_same_v<T, string>) {
                if (data.size() < 1u) throw runtime_error("Erroneous data feeded to msg::FunctionCall::decodeParameter");
                auto size = static_cast<size_t>(data[1]);
                if (data.size() < 2u + size) throw runtime_error("Erroneous data feeded to msg::FunctionCall::decodeParameter");
                param = string(reinterpret_cast<const char*>(&data[2]), size);
                data = data.subspan(2 + size);
            }
            break;
        case CodedType::string:
        case CodedType::exception:
            if constexpr (is_same_v<T, string>) {
                if (data.size() < 1u) throw runtime_error("Erroneous data feeded to msg::FunctionCall::decodeParameter");
                uint16_t size;
                copy_n(&data[1], 2, reinterpret_cast<byte*>(&size));
                if (data.size() < 3u + size) throw runtime_error("Erroneous data feeded to msg::FunctionCall::decodeParameter");
                param = string(reinterpret_cast<const char*>(&data[3]), size);
                data = data.subspan(3 + size);
            }
            break;
        case CodedType::number:
            if constexpr (is_arithmetic_v<T>) {
                double value;
                if (data.size() < 1u + sizeof(value))
                    throw runtime_error("Erroneous 'number' data feeded to msg::FunctionCall::decodeParameter");
                copy_n(&data[1], sizeof(value), reinterpret_cast<byte*>(&value));
                param = static_cast<T>(value);
                data = data.subspan(1 + sizeof(value));
            }
            break;
        case CodedType::tuple:
            if constexpr (is_tuple_v<T>) {
                auto tupleSize = static_cast<size_t>(data[1]);
                if (tuple_size_v<T> != tupleSize)
                    throw runtime_error("Parameter is a "s + to_string(tuple_size_v<T>) +
                                        " elements tuple but decoded tuple only has " + to_string(tupleSize) + " elements.");
                cout << "tuple expected\n";
                data = data.subspan(2);
                std::apply([&](auto&... tupleArgs) { ((decodeParameter(tupleArgs, data)), ...); }, param);
            }
            else
                throw runtime_error("Wrong parameter type : std::tuple expected");
            break;

        default: param = {};
        }
    }